

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_lazy_or_inplace
               (roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  _Bool _Var1;
  uint8_t uVar2;
  container_t *c_00;
  byte in_DL;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c2_1;
  container_t *c;
  container_t *c2;
  uint8_t old_type1;
  container_t *old_c1;
  container_t *c1;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  int length2;
  int length1;
  uint8_t result_type;
  undefined7 in_stack_ffffffffffffff78;
  uint8_t in_stack_ffffffffffffff7f;
  container_t *in_stack_ffffffffffffff80;
  roaring_bitmap_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar3;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  container_t *in_stack_ffffffffffffff98;
  container_t *in_stack_ffffffffffffffa0;
  bitset_container_t *in_stack_ffffffffffffffa8;
  bitset_container_t *local_38;
  ushort local_2a;
  ushort local_28;
  uint8_t local_26;
  uint8_t local_25;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  uint8_t local_12;
  byte local_11;
  roaring_array_t *local_10;
  roaring_array_t *local_8;
  
  local_11 = in_DL & 1;
  local_12 = '\0';
  local_18 = in_RDI->size;
  local_1c = in_RSI->size;
  if (local_1c != 0) {
    if (local_18 == 0) {
      roaring_bitmap_overwrite
                ((roaring_bitmap_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
    }
    else {
      local_20 = 0;
      local_24 = 0;
      local_10 = in_RSI;
      local_8 = in_RDI;
      local_28 = ra_get_key_at_index(in_RDI,0);
      local_2a = ra_get_key_at_index(local_10,(uint16_t)local_24);
      while( true ) {
        while (local_28 != local_2a) {
          if (local_28 < local_2a) {
            local_20 = local_20 + 1;
            if (local_20 == local_18) goto LAB_00105ed8;
            local_28 = ra_get_key_at_index(local_8,(uint16_t)local_20);
          }
          else {
            in_stack_ffffffffffffff98 =
                 ra_get_container_at_index(local_10,(uint16_t)local_24,&local_26);
            is_cow((roaring_bitmap_t *)local_10);
            in_stack_ffffffffffffffa0 =
                 get_copy_of_container
                           (in_stack_ffffffffffffff98,
                            (uint8_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                            ,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
            _Var1 = is_cow((roaring_bitmap_t *)local_10);
            if (_Var1) {
              ra_set_container_at_index(local_10,local_24,in_stack_ffffffffffffffa0,local_26);
            }
            ra_insert_new_key_value_at
                      ((roaring_array_t *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       (uint16_t)((ulong)in_stack_ffffffffffffff88 >> 0x10),
                       in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
            local_20 = local_20 + 1;
            local_18 = local_18 + 1;
            local_24 = local_24 + 1;
            if (local_24 == local_1c) goto LAB_00105ed8;
            local_2a = ra_get_key_at_index(local_10,(uint16_t)local_24);
          }
        }
        c_00 = ra_get_container_at_index(local_8,(uint16_t)local_20,&local_25);
        _Var1 = container_is_full((container_t *)
                                  CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),'\0'
                                 );
        if (!_Var1) {
          if (((local_11 & 1) == 0) || (uVar2 = get_container_type(c_00,local_25), uVar2 == '\x01'))
          {
            local_38 = (bitset_container_t *)
                       get_writable_copy_if_shared
                                 ((container_t *)
                                  CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                                  (uint8_t *)0x105c80);
          }
          else {
            container_mutable_unwrap_shared(c_00,&local_25);
            local_38 = container_to_bitset(in_stack_ffffffffffffff88,
                                           (uint8_t)((ulong)in_stack_ffffffffffffff80 >> 0x38));
            container_free(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
            local_25 = '\x01';
          }
          ra_get_container_at_index(local_10,(uint16_t)local_24,&local_26);
          in_stack_ffffffffffffffa8 =
               (bitset_container_t *)
               container_lazy_ior(in_stack_ffffffffffffffa8,
                                  (uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38),
                                  in_stack_ffffffffffffff98,
                                  (uint8_t)((uint)in_stack_ffffffffffffff94 >> 0x18),
                                  (uint8_t *)in_stack_ffffffffffffff88);
          if (in_stack_ffffffffffffffa8 != local_38) {
            container_free(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
          }
          ra_set_container_at_index(local_8,local_20,in_stack_ffffffffffffffa8,local_12);
        }
        local_20 = local_20 + 1;
        local_24 = local_24 + 1;
        if ((local_20 == local_18) || (local_24 == local_1c)) break;
        local_28 = ra_get_key_at_index(local_8,(uint16_t)local_20);
        local_2a = ra_get_key_at_index(local_10,(uint16_t)local_24);
      }
LAB_00105ed8:
      if (local_20 == local_18) {
        iVar3 = local_24;
        iVar4 = local_1c;
        is_cow((roaring_bitmap_t *)local_10);
        ra_append_copy_range
                  ((roaring_array_t *)CONCAT44(iVar4,iVar3),local_10,
                   (int32_t)((ulong)local_8 >> 0x20),(int32_t)local_8,
                   (_Bool)in_stack_ffffffffffffff7f);
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_lazy_or_inplace(roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2,
                                    const bool bitsetconversion) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            if (!container_is_full(c1, type1)) {
                if ((bitsetconversion == false) ||
                    (get_container_type(c1, type1) == BITSET_CONTAINER_TYPE)) {
                    c1 = get_writable_copy_if_shared(c1, &type1);
                } else {
                    // convert to bitset
                    container_t *old_c1 = c1;
                    uint8_t old_type1 = type1;
                    c1 = container_mutable_unwrap_shared(c1, &type1);
                    c1 = container_to_bitset(c1, type1);
                    container_free(old_c1, old_type1);
                    type1 = BITSET_CONTAINER_TYPE;
                }

                container_t *c2 = ra_get_container_at_index(
                    &x2->high_low_container, (uint16_t)pos2, &type2);
                container_t *c =
                    container_lazy_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }

                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}